

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O3

void chan_calc(FM_OPN *OPN,FM_CH *CH,int chnum)

{
  UINT32 *pUVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  
  uVar3 = OPN->LFO_AM >> (CH->ams & 0x1f);
  if (CH->Muted != '\0') {
    return;
  }
  OPN->m2 = 0;
  OPN->c1 = 0;
  OPN->c2 = 0;
  OPN->mem = 0;
  *CH->mem_connect = CH->mem_value;
  uVar5 = (CH->SLOT[0].AMmask & uVar3) + CH->SLOT[0].vol_out;
  iVar4 = 0;
  if (uVar5 < 0x340) {
    iVar4 = 0;
    iVar6 = 0;
    if (CH->FB < 10) {
      iVar6 = CH->op1_out[1] + CH->op1_out[0] << (0x10 - CH->FB & 0x1f);
    }
    uVar5 = uVar5 * 8 +
            *(int *)((long)sin_tab + (ulong)((CH->SLOT[0].phase & 0x3ff0000) + iVar6 >> 0xe & 0xffc)
                    );
    if (uVar5 < 0x1a00) {
      iVar4 = tl_tab[uVar5];
    }
  }
  CH->op1_out[0] = CH->op1_out[1];
  CH->op1_out[1] = iVar4;
  if (CH->connect1 == (int *)0x0) {
    OPN->c2 = iVar4;
    OPN->c1 = iVar4;
    OPN->mem = iVar4;
  }
  else {
    *CH->connect1 = iVar4;
  }
  uVar5 = (CH->SLOT[1].AMmask & uVar3) + CH->SLOT[1].vol_out;
  if (uVar5 < 0x340) {
    uVar5 = uVar5 * 8 +
            *(int *)((long)sin_tab +
                    (ulong)(OPN->m2 * 0x8000 + (CH->SLOT[1].phase & 0x3ff0000) >> 0xe & 0xffc));
    iVar4 = 0;
    if (uVar5 < 0x1a00) {
      iVar4 = tl_tab[uVar5];
    }
    *CH->connect3 = *CH->connect3 + iVar4;
  }
  uVar5 = (CH->SLOT[2].AMmask & uVar3) + CH->SLOT[2].vol_out;
  if (uVar5 < 0x340) {
    uVar5 = uVar5 * 8 +
            *(int *)((long)sin_tab +
                    (ulong)(OPN->c1 * 0x8000 + (CH->SLOT[2].phase & 0x3ff0000) >> 0xe & 0xffc));
    iVar4 = 0;
    if (uVar5 < 0x1a00) {
      iVar4 = tl_tab[uVar5];
    }
    *CH->connect2 = *CH->connect2 + iVar4;
  }
  uVar3 = (uVar3 & CH->SLOT[3].AMmask) + CH->SLOT[3].vol_out;
  if (uVar3 < 0x340) {
    uVar3 = uVar3 * 8 +
            *(int *)((long)sin_tab +
                    (ulong)(OPN->c2 * 0x8000 + (CH->SLOT[3].phase & 0x3ff0000) >> 0xe & 0xffc));
    iVar4 = 0;
    if (uVar3 < 0x1a00) {
      iVar4 = tl_tab[uVar3];
    }
    *CH->connect4 = *CH->connect4 + iVar4;
  }
  CH->mem_value = OPN->mem;
  iVar4 = CH->pms;
  if (iVar4 == 0) {
LAB_00128920:
    iVar4 = CH->SLOT[1].Incr;
    pUVar1 = &CH->SLOT[0].phase;
    *pUVar1 = *pUVar1 + CH->SLOT[0].Incr;
    pUVar1 = &CH->SLOT[2].phase;
    *pUVar1 = *pUVar1 + CH->SLOT[2].Incr;
    pUVar1 = &CH->SLOT[1].phase;
    *pUVar1 = *pUVar1 + iVar4;
LAB_00128938:
    uVar3 = CH->SLOT[3].Incr;
  }
  else {
    if ((((OPN->ST).mode & 0xc0) == 0) || (OPN->P_CH + 2 != CH)) {
      uVar3 = CH->block_fnum;
      if (lfo_pm_table[iVar4 + OPN->LFO_PM + (uVar3 & 0x7f0) * 0x10] == 0) goto LAB_00128920;
      uVar3 = OPN->fn_table
              [lfo_pm_table[iVar4 + OPN->LFO_PM + (uVar3 & 0x7f0) * 0x10] + uVar3 * 2 & 0xfff] >>
              (7U - (char)(uVar3 >> 0xb) & 0x1f);
      bVar2 = CH->kcode;
      iVar4 = CH->SLOT[0].DT[bVar2] + uVar3;
      if (iVar4 < 0) {
        iVar4 = iVar4 + OPN->fn_max;
      }
      pUVar1 = &CH->SLOT[0].phase;
      *pUVar1 = *pUVar1 + (iVar4 * CH->SLOT[0].mul >> 1);
      iVar4 = CH->SLOT[2].DT[bVar2] + uVar3;
      if (iVar4 < 0) {
        iVar4 = iVar4 + OPN->fn_max;
      }
      pUVar1 = &CH->SLOT[2].phase;
      *pUVar1 = *pUVar1 + (iVar4 * CH->SLOT[2].mul >> 1);
      iVar4 = CH->SLOT[1].DT[bVar2] + uVar3;
      if (iVar4 < 0) {
        iVar4 = iVar4 + OPN->fn_max;
      }
      pUVar1 = &CH->SLOT[1].phase;
      *pUVar1 = *pUVar1 + (iVar4 * CH->SLOT[1].mul >> 1);
      iVar4 = uVar3 + CH->SLOT[3].DT[bVar2];
    }
    else {
      bVar2 = CH->kcode;
      iVar4 = iVar4 + OPN->LFO_PM;
      uVar3 = (OPN->SL3).block_fnum[1];
      if (lfo_pm_table[(uVar3 & 0x7f0) * 0x10 + iVar4] == 0) {
        pUVar1 = &CH->SLOT[0].phase;
        *pUVar1 = *pUVar1 + CH->SLOT[0].Incr;
      }
      else {
        iVar6 = (OPN->fn_table[lfo_pm_table[(uVar3 & 0x7f0) * 0x10 + iVar4] + uVar3 * 2 & 0xfff] >>
                (7U - (char)(uVar3 >> 0xb) & 0x1f)) + CH->SLOT[0].DT[bVar2];
        if (iVar6 < 0) {
          iVar6 = iVar6 + OPN->fn_max;
        }
        pUVar1 = &CH->SLOT[0].phase;
        *pUVar1 = *pUVar1 + (iVar6 * CH->SLOT[0].mul >> 1);
      }
      uVar3 = (OPN->SL3).block_fnum[2];
      if (lfo_pm_table[(uVar3 & 0x7f0) * 0x10 + iVar4] == 0) {
        pUVar1 = &CH->SLOT[2].phase;
        *pUVar1 = *pUVar1 + CH->SLOT[2].Incr;
      }
      else {
        iVar6 = (OPN->fn_table[lfo_pm_table[(uVar3 & 0x7f0) * 0x10 + iVar4] + uVar3 * 2 & 0xfff] >>
                (7U - (char)(uVar3 >> 0xb) & 0x1f)) + CH->SLOT[2].DT[bVar2];
        if (iVar6 < 0) {
          iVar6 = iVar6 + OPN->fn_max;
        }
        pUVar1 = &CH->SLOT[2].phase;
        *pUVar1 = *pUVar1 + (iVar6 * CH->SLOT[2].mul >> 1);
      }
      uVar3 = (OPN->SL3).block_fnum[0];
      if (lfo_pm_table[(uVar3 & 0x7f0) * 0x10 + iVar4] == 0) {
        pUVar1 = &CH->SLOT[1].phase;
        *pUVar1 = *pUVar1 + CH->SLOT[1].Incr;
      }
      else {
        iVar6 = (OPN->fn_table[lfo_pm_table[(uVar3 & 0x7f0) * 0x10 + iVar4] + uVar3 * 2 & 0xfff] >>
                (7U - (char)(uVar3 >> 0xb) & 0x1f)) + CH->SLOT[1].DT[bVar2];
        if (iVar6 < 0) {
          iVar6 = iVar6 + OPN->fn_max;
        }
        pUVar1 = &CH->SLOT[1].phase;
        *pUVar1 = *pUVar1 + (iVar6 * CH->SLOT[1].mul >> 1);
      }
      uVar3 = CH->block_fnum;
      if (lfo_pm_table[(uVar3 & 0x7f0) * 0x10 + iVar4] == 0) goto LAB_00128938;
      iVar4 = (OPN->fn_table[lfo_pm_table[(uVar3 & 0x7f0) * 0x10 + iVar4] + uVar3 * 2 & 0xfff] >>
              (7U - (char)(uVar3 >> 0xb) & 0x1f)) + CH->SLOT[3].DT[bVar2];
    }
    if (iVar4 < 0) {
      iVar4 = iVar4 + OPN->fn_max;
    }
    uVar3 = iVar4 * CH->SLOT[3].mul >> 1;
  }
  pUVar1 = &CH->SLOT[3].phase;
  *pUVar1 = *pUVar1 + uVar3;
  return;
}

Assistant:

INLINE void chan_calc(FM_OPN *OPN, FM_CH *CH, int chnum)
{
	INT32 out = 0;
	UINT32 AM = OPN->LFO_AM >> CH->ams;
	unsigned int eg_out;

	if (CH->Muted)
		return;

	OPN->m2 = OPN->c1 = OPN->c2 = OPN->mem = 0;

	*CH->mem_connect = CH->mem_value;  /* restore delayed sample (MEM) value to m2 or c2 */

	eg_out = volume_calc(&CH->SLOT[SLOT1]);
	if( eg_out < ENV_QUIET )  /* SLOT 1 */
	{
		if (CH->FB < SIN_BITS)
			out = (CH->op1_out[0] + CH->op1_out[1]) << (FREQ_SH - CH->FB);

		out = op_calc1(CH->SLOT[SLOT1].phase, eg_out, out);
	}

	CH->op1_out[0] = CH->op1_out[1];
	CH->op1_out[1] = out;

	if( !CH->connect1 ){
		/* algorithm 5  */
		OPN->mem = OPN->c1 = OPN->c2 = out;
	}else{
		/* other algorithms */
		*CH->connect1 = out;
	}

	eg_out = volume_calc(&CH->SLOT[SLOT3]);
	if( eg_out < ENV_QUIET )    /* SLOT 3 */
		*CH->connect3 += op_calc(CH->SLOT[SLOT3].phase, eg_out, OPN->m2);

	eg_out = volume_calc(&CH->SLOT[SLOT2]);
	if( eg_out < ENV_QUIET )    /* SLOT 2 */
		*CH->connect2 += op_calc(CH->SLOT[SLOT2].phase, eg_out, OPN->c1);

	eg_out = volume_calc(&CH->SLOT[SLOT4]);
	if( eg_out < ENV_QUIET )    /* SLOT 4 */
		*CH->connect4 += op_calc(CH->SLOT[SLOT4].phase, eg_out, OPN->c2);

	/* store current MEM */
	CH->mem_value = OPN->mem;

	/* update phase counters AFTER output calculations */
	if (CH->pms)
	{
		/* 3-slot mode */
		if ((OPN->ST.mode & 0xC0) && (CH == &OPN->P_CH[2]))
		{
			/* keyscale code is not modified by LFO */
			UINT8 kc = CH->kcode;
			UINT32 pm = CH->pms + OPN->LFO_PM;
			update_phase_lfo_slot(OPN, &CH->SLOT[SLOT1], pm, kc, OPN->SL3.block_fnum[1]);
			update_phase_lfo_slot(OPN, &CH->SLOT[SLOT2], pm, kc, OPN->SL3.block_fnum[2]);
			update_phase_lfo_slot(OPN, &CH->SLOT[SLOT3], pm, kc, OPN->SL3.block_fnum[0]);
			update_phase_lfo_slot(OPN, &CH->SLOT[SLOT4], pm, kc, CH->block_fnum);
		}
		else
		{
			update_phase_lfo_channel(OPN, CH);
		}
	}
	else  /* no LFO phase modulation */
	{
		CH->SLOT[SLOT1].phase += CH->SLOT[SLOT1].Incr;
		CH->SLOT[SLOT2].phase += CH->SLOT[SLOT2].Incr;
		CH->SLOT[SLOT3].phase += CH->SLOT[SLOT3].Incr;
		CH->SLOT[SLOT4].phase += CH->SLOT[SLOT4].Incr;
	}
}